

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void __thiscall TextFile::openMemory(TextFile *this,string *content)

{
  long lVar1;
  string *content_local;
  TextFile *this_local;
  
  this->fromMemory = true;
  std::__cxx11::string::operator=((string *)&this->content,(string *)content);
  this->contentPos = 0;
  lVar1 = std::__cxx11::string::size();
  this->size_ = lVar1;
  this->encoding = UTF8;
  this->mode = Read;
  this->lineCount = 0;
  return;
}

Assistant:

void TextFile::openMemory(const std::string& content)
{
	fromMemory = true;
	this->content = content;
	contentPos = 0;
	size_ = (long) content.size();
	encoding = UTF8;
	mode = Read;
	lineCount = 0;
}